

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O3

Pattern * __thiscall
trieste::In<trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef>
          (Pattern *__return_storage_ptr__,trieste *this,Token *type1,TokenDef *types,
          TokenDef *types_1,TokenDef *types_2,TokenDef *types_3)

{
  Pattern *pPVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  initializer_list<trieste::Token> __l;
  allocator_type local_112;
  less<trieste::Token> local_111;
  PatternPtr local_110;
  Pattern *local_100;
  undefined8 local_f8;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_f0;
  undefined1 local_c0 [104];
  Token local_58;
  Token *local_50;
  TokenDef *local_48;
  TokenDef *local_40;
  TokenDef *local_38;
  
  local_f8 = *(undefined8 *)this;
  local_100 = __return_storage_ptr__;
  local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi)->_M_use_count = 1;
  (local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi)->_M_weak_count = 1;
  (local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002cee10;
  local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._M_use_count = 0;
  local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._M_weak_count = 0;
  local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__PatternDef_002cee60;
  local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[2]._M_use_count = (undefined4)local_f8;
  local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[2]._M_weak_count = local_f8._4_4_;
  local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[3]._vptr__Sp_counted_base = (_func_int **)type1;
  *(TokenDef **)
   &local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[3]._M_use_count = types;
  local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[4]._vptr__Sp_counted_base = (_func_int **)types_1;
  *(TokenDef **)
   &local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[4]._M_use_count = types_2;
  local_58.def = *(TokenDef **)this;
  __l._M_len = 5;
  __l._M_array = &local_58;
  local_50 = type1;
  local_48 = types;
  local_40 = types_1;
  local_38 = types_2;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            (&local_f0,__l,&local_111,&local_112);
  detail::FastPattern::match_parent((FastPattern *)local_c0,&local_f0);
  pPVar1 = local_100;
  detail::Pattern::Pattern(local_100,&local_110,(FastPattern *)local_c0);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)(local_c0 + 0x30));
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)local_c0);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&local_f0);
  if (local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return pPVar1;
}

Assistant:

inline detail::Pattern In(const Token& type1, const Ts&... types)
  {
    std::array<Token, 1 + sizeof...(types)> types_ = {type1, types...};
    return detail::Pattern(
      std::make_shared<detail::Inside<1 + sizeof...(types)>>(types_),
      detail::FastPattern::match_parent({type1, types...}));
  }